

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_params.cpp
# Opt level: O3

session_params * __thiscall
libtorrent::session_params::operator=(session_params *this,session_params *param_1)

{
  pointer psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  undefined3 uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  local_28;
  
  settings_pack::operator=
            (&this->settings,
             (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *)
             param_1);
  (this->flags).m_val = (param_1->flags).m_val;
  local_28.
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->extensions).
       super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar1 = (param_1->extensions).
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->extensions).
       super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->extensions).
       super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->extensions).
       super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar1;
  (this->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->extensions).
       super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->extensions).
  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ::~vector(&local_28);
  ::std::
  vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ::_M_move_assign(&(this->dht_state).nids,&param_1->dht_state);
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::_M_move_assign(&(this->dht_state).nodes,&(param_1->dht_state).nodes);
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::_M_move_assign(&(this->dht_state).nodes6,&(param_1->dht_state).nodes6);
  ::std::
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>_(const_libtorrent::settings_interface_&)>
  ::operator=(&this->dht_storage_constructor,&param_1->dht_storage_constructor);
  ::std::
  function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
  ::operator=(&this->disk_io_constructor,&param_1->disk_io_constructor);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&this->ext_state,&param_1->ext_state);
  ip_filter::operator=(&this->ip_filter,&param_1->ip_filter);
  iVar2 = (param_1->dht_settings).search_branching;
  iVar3 = (param_1->dht_settings).max_fail_count;
  iVar4 = (param_1->dht_settings).max_torrents;
  iVar5 = (param_1->dht_settings).max_dht_items;
  iVar6 = (param_1->dht_settings).max_peers;
  iVar7 = (param_1->dht_settings).max_torrent_search_reply;
  bVar8 = (param_1->dht_settings).restrict_routing_ips;
  bVar9 = (param_1->dht_settings).restrict_search_ips;
  bVar10 = (param_1->dht_settings).extended_routing_table;
  bVar11 = (param_1->dht_settings).aggressive_lookups;
  bVar12 = (param_1->dht_settings).privacy_lookups;
  bVar13 = (param_1->dht_settings).enforce_node_id;
  bVar14 = (param_1->dht_settings).ignore_dark_internet;
  uVar15 = (param_1->dht_settings).field_0x23;
  iVar16 = (param_1->dht_settings).block_timeout;
  iVar17 = (param_1->dht_settings).block_ratelimit;
  bVar18 = (param_1->dht_settings).read_only;
  uVar19 = *(undefined3 *)&(param_1->dht_settings).field_0x2d;
  iVar20 = (param_1->dht_settings).item_lifetime;
  iVar21 = (param_1->dht_settings).upload_rate_limit;
  iVar22 = (param_1->dht_settings).sample_infohashes_interval;
  iVar23 = (param_1->dht_settings).max_infohashes_sample_count;
  (this->dht_settings).max_peers_reply = (param_1->dht_settings).max_peers_reply;
  (this->dht_settings).search_branching = iVar2;
  (this->dht_settings).max_fail_count = iVar3;
  (this->dht_settings).max_torrents = iVar4;
  (this->dht_settings).max_dht_items = iVar5;
  (this->dht_settings).max_peers = iVar6;
  (this->dht_settings).max_torrent_search_reply = iVar7;
  (this->dht_settings).restrict_routing_ips = bVar8;
  (this->dht_settings).restrict_search_ips = bVar9;
  (this->dht_settings).extended_routing_table = bVar10;
  (this->dht_settings).aggressive_lookups = bVar11;
  (this->dht_settings).privacy_lookups = bVar12;
  (this->dht_settings).enforce_node_id = bVar13;
  (this->dht_settings).ignore_dark_internet = bVar14;
  (this->dht_settings).field_0x23 = uVar15;
  (this->dht_settings).block_timeout = iVar16;
  (this->dht_settings).block_ratelimit = iVar17;
  (this->dht_settings).read_only = bVar18;
  *(undefined3 *)&(this->dht_settings).field_0x2d = uVar19;
  (this->dht_settings).item_lifetime = iVar20;
  (this->dht_settings).upload_rate_limit = iVar21;
  (this->dht_settings).sample_infohashes_interval = iVar22;
  (this->dht_settings).max_infohashes_sample_count = iVar23;
  return this;
}

Assistant:

TORRENT_VERSION_NAMESPACE_3_END

session_params read_session_params(bdecode_node const& e, save_state_flags_t const flags)
{
	session_params params;

	if (e.type() != bdecode_node::dict_t) return params;

#ifndef TORRENT_DISABLE_DHT
#if TORRENT_ABI_VERSION <= 2
	if (flags & session_handle::save_dht_settings)
#else
	if (flags & session_handle::save_settings)
#endif
	{
		bdecode_node settings = e.dict_find_dict("dht");
		if (settings)
		{
			aux::apply_deprecated_dht_settings(params.settings, settings);
#if TORRENT_ABI_VERSION <= 2
			params.dht_settings = dht::read_dht_settings(settings);
#endif
		}
	}
#endif

	if (flags & session_handle::save_settings)
	{
		bdecode_node settings = e.dict_find_dict("settings");
		if (settings) params.settings = load_pack_from_dict(settings);
	}

#ifndef TORRENT_DISABLE_DHT
	if (flags & session_handle::save_dht_state)
	{
		bdecode_node settings = e.dict_find_dict("dht state");
		if (settings)
		{
			params.dht_state = dht::read_dht_state(settings);
		}
	}
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
	if (flags & session::save_extension_state)
	{
		auto ext = e.dict_find_dict("extensions");
		if (ext)
		{
			for (int i = 0; i < ext.dict_size(); ++i)
			{
				auto const [key, val] = ext.dict_at(i);
				if (val.type() != bdecode_node::string_t) continue;
				params.ext_state[std::string(key)] = std::string(val.string_value());
			}
		}
	}
#endif

	if (flags & session_handle::save_ip_filter)
	{
		auto const v4 = e.dict_find_list("ip_filter4");
		ip_filter load;
		if (v4)
		{
			int const count = v4.list_size();
			for (int i = 0; i < count; ++i)
			{
				auto const str = v4.list_string_value_at(i);
				if (str.size() < 4 + 4 + 4) continue;
				char const* ptr = str.data();
				auto const first = aux::read_v4_address(ptr);
				auto const last = aux::read_v4_address(ptr);
				auto const f = aux::read_uint32(ptr);
				// ignore invalid entries
				if (first > last) continue;
				load.add_rule(first, last, f);
			}
		}

		auto const v6 = e.dict_find_list("ip_filter6");
		if (v6)
		{
			int const count = v6.list_size();
			for (int i = 0; i < count; ++i)
			{
				auto const str = v6.list_string_value_at(i);
				if (str.size() < 16 + 16 + 4) continue;
				char const* ptr = str.data();
				auto const first = aux::read_v6_address(ptr);
				auto const last = aux::read_v6_address(ptr);
				auto const f = aux::read_uint32(ptr);
				// ignore invalid entries
				if (first > last) continue;
				load.add_rule(first, last, f);
			}
		}

		if (!load.empty())
		{
			params.ip_filter = std::move(load);
		}
	}

	return params;
}

session_params read_session_params(span<char const> buf
	, save_state_flags_t const flags)
{
	return read_session_params(bdecode(buf), flags);
}

entry write_session_params(session_params const& sp, save_state_flags_t const flags)
{
	entry e(entry::data_type::dictionary_t);

#ifndef TORRENT_DISABLE_DHT
#if TORRENT_ABI_VERSION <= 2
	if (flags & session_handle::save_dht_settings)
	{
		e["dht"] = dht::save_dht_settings(sp.dht_settings);
	}
#endif

	if (flags & session::save_dht_state)
	{
		e["dht state"] = dht::save_dht_state(sp.dht_state);
	}
#endif

	if (flags & session_handle::save_settings)
	{
		save_settings_to_dict(sp.settings, e["settings"].dict());
	}

#ifndef TORRENT_DISABLE_EXTENSIONS
	if (flags & session::save_extension_state)
	{
		auto& ext = e["extensions"].dict();
		for (auto const& val : sp.ext_state) ext[val.first] = val.second;
	}
#endif

	if (flags & session_handle::save_ip_filter)
	{
		auto const [v4, v6] = sp.ip_filter.export_filter();
		if (!v4.empty())
		{
			auto& v4_list = e["ip_filter4"].list();
			for (auto const& ent : v4)
			{
				v4_list.emplace_back();
				auto ptr = std::back_inserter(v4_list.back().string());
				aux::write_address(ent.first, ptr);
				aux::write_address(ent.last, ptr);
				aux::write_uint32(ent.flags, ptr);
			}
		}
		if (!v6.empty())
		{
			auto& v6_list = e["ip_filter6"].list();
			for (auto const& ent : v6)
			{
				v6_list.emplace_back();
				auto ptr = std::back_inserter(v6_list.back().string());
				aux::write_address(ent.first, ptr);
				aux::write_address(ent.last, ptr);
				aux::write_uint32(ent.flags, ptr);
			}
		}
	}

	return e;
}

std::vector<char> write_session_params_buf(session_params const& sp, save_state_flags_t const flags)
{
	auto const e = write_session_params(sp, flags);
	std::vector<char> ret;
	bencode(std::back_inserter(ret), e);
	return ret;
}

}